

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *context,error_code *ec)

{
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this_00;
  undefined1 in_DL;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  bigint n;
  undefined7 in_stack_00000070;
  size_type in_stack_000000c0;
  char *in_stack_000000c8;
  bigint *in_stack_000000f8;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000100;
  error_code *in_stack_00000128;
  ser_context *in_stack_00000130;
  string_view_type *in_stack_00000138;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000140;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffff80
  ;
  uint64_t in_stack_ffffffffffffffc8;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_ffffffffffffffd0
  ;
  
  switch(in_DL) {
  case 2:
    this_00 = (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
              std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
              (in_stack_000000c8,in_stack_000000c0);
    write_bignum(in_stack_00000100,in_stack_000000f8);
    end_value(this_00);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
              ((basic_bigint<std::allocator<unsigned_char>_> *)this_00);
    break;
  case 3:
    write_decimal_value(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
    break;
  case 4:
    write_tag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    write_string((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 CONCAT17(tag,in_stack_00000070),(string_view *)context);
    end_value(in_stack_ffffffffffffff80);
    break;
  default:
    write_string((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 CONCAT17(tag,in_stack_00000070),(string_view *)context);
    end_value(in_stack_ffffffffffffff80);
    break;
  case 9:
    write_tag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    write_string((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 CONCAT17(tag,in_stack_00000070),(string_view *)context);
    end_value(in_stack_ffffffffffffff80);
    break;
  case 10:
    write_hexfloat_value(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
    break;
  case 0xc:
    write_tag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    write_string((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 CONCAT17(tag,in_stack_00000070),(string_view *)context);
    end_value(in_stack_ffffffffffffff80);
    break;
  case 0xe:
    write_tag(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    write_string((basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
                 CONCAT17(tag,in_stack_00000070),(string_view *)context);
    end_value(in_stack_ffffffffffffff80);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context& context, std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::bigint:
            {
                bigint n = bigint::from_string(sv.data(), sv.length());
                write_bignum(n);
                end_value();
                break;
            }
            case semantic_tag::bigdec:
            {
                write_decimal_value(sv, context, ec);
                break;
            }
            case semantic_tag::bigfloat:
            {
                write_hexfloat_value(sv, context, ec);
                break;
            }
            case semantic_tag::datetime:
            {
                write_tag(0);

                write_string(sv);
                end_value();
                break;
            }
            case semantic_tag::uri:
            {
                write_tag(32);
                write_string(sv);
                end_value();
                break;
            }
            case semantic_tag::base64url:
            {
                write_tag(33);
                write_string(sv);
                end_value();
                break;
            }
            case semantic_tag::base64:
            {
                write_tag(34);
                write_string(sv);
                end_value();
                break;
            }
            default:
            {
                write_string(sv);
                end_value();
                break;
            }
        }
        JSONCONS_VISITOR_RETURN;
    }